

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash64_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  
  uVar1 = farmhash64_na(s,len);
  uVar1 = farmhash_len_16(uVar1 - seed0,seed1);
  return uVar1;
}

Assistant:

uint64_t farmhash64_with_seeds(const char* s, size_t len, uint64_t seed0, uint64_t seed1) {
  return debug_tweak64(farmhash64_na_with_seeds(s, len, seed0, seed1));
}